

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<unsigned_long_long,QOpenGL2GradientCache::CacheInfo>::
emplace<QOpenGL2GradientCache::CacheInfo_const&>
          (iterator *__return_storage_ptr__,void *this,unsigned_long_long *key,CacheInfo *args)

{
  Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *pDVar1;
  long in_FS_OFFSET;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *local_60;
  QArrayData *local_58;
  pair<double,_QColor> *local_50;
  qsizetype local_48;
  qreal local_40;
  InterpolationMode local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *this;
  if (pDVar1 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                 *)0x0) {
    local_60 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                *)0x0;
    local_58 = *(QArrayData **)((long)this + 8);
LAB_0013f645:
    pDVar1 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *
             )0x0;
LAB_0013f672:
    pDVar1 = QHashPrivate::
             Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>::
             detached(pDVar1);
    *(Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> **)this =
         pDVar1;
LAB_0013f67b:
    emplace_helper<QOpenGL2GradientCache::CacheInfo_const&>(__return_storage_ptr__,this,key,args);
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::~QMultiHash
              ((QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)&local_60);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_58 = *(QArrayData **)((long)this + 8);
      local_60 = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *this;
        if (pDVar1 == (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                       *)0x0) goto LAB_0013f645;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0013f672;
      goto LAB_0013f67b;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        emplace_helper<QOpenGL2GradientCache::CacheInfo_const&>
                  (__return_storage_ptr__,this,key,args);
        return __return_storage_ptr__;
      }
      goto LAB_0013f736;
    }
    local_60 = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
                *)CONCAT44(local_60._4_4_,args->texId);
    local_58 = &((args->stops).d.d)->super_QArrayData;
    local_50 = (args->stops).d.ptr;
    local_48 = (args->stops).d.size;
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_38 = args->interpolationMode;
    local_40 = args->opacity;
    QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
    emplace_helper<QOpenGL2GradientCache::CacheInfo>
              (__return_storage_ptr__,
               (QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)this,key,
               (CacheInfo *)&local_60);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,0x18,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0013f736:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }